

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

unique_ptr<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetMetadata(DescriptorScriptPubKeyMan *this,CTxDestination *dest)

{
  _func_int **pp_Var1;
  undefined8 store;
  int iVar2;
  CKeyMetadata *this_00;
  CTxDestination *in_RDX;
  pointer *__ptr;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock70;
  CKeyID key_id;
  KeyOriginInfo orig;
  unique_lock<std::recursive_mutex> local_78;
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined8 local_38;
  shared_count local_30;
  
  local_30.pi_ = *(sp_counted_base **)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)local_50,in_RDX);
  GetSigningProvider((DescriptorScriptPubKeyMan *)local_68,(CScript *)dest,
                     SUB81((CScript *)local_50,0));
  store = local_68._0_8_;
  local_68._0_8_ = (_func_int **)0x0;
  if (0x1c < local_38._4_4_) {
    free((void *)local_50._0_8_);
    local_50._0_8_ = (char *)0x0;
  }
  if ((SigningProvider *)store != (SigningProvider *)0x0) {
    local_50._8_8_ = (void *)0x0;
    local_50._16_8_ = 0;
    local_38 = (element_type *)0x0;
    GetKeyForDestination((CKeyID *)local_68,(SigningProvider *)store,in_RDX);
    iVar2 = (*(*(_func_int ***)store)[7])(store,local_68,local_50);
    if ((char)iVar2 == '\0') {
      if ((void *)local_50._8_8_ != (void *)0x0) {
        operator_delete((void *)local_50._8_8_,(long)local_38 - local_50._8_8_);
      }
    }
    else {
      local_78._M_device =
           (mutex_type *)
           ((long)&dest[7].
                   super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   ._M_u + 0x20);
      local_78._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&local_78);
      this_00 = (CKeyMetadata *)operator_new(0x70);
      CKeyMetadata::CKeyMetadata(this_00);
      (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)this_00;
      *(undefined4 *)(this_00->key_origin).fingerprint = local_50._0_4_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&(this_00->key_origin).path,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_50 + 8));
      pp_Var1 = (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan;
      *(undefined1 *)(pp_Var1 + 0xd) = 1;
      pp_Var1[1] = *(_func_int **)
                    &dest[5].
                     super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     ._M_u;
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
      if ((void *)local_50._8_8_ != (void *)0x0) {
        operator_delete((void *)local_50._8_8_,(long)local_38 - local_50._8_8_);
      }
      if ((char)iVar2 != '\0') goto LAB_0022a5bf;
    }
  }
  (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)0x0;
LAB_0022a5bf:
  if ((SigningProvider *)store != (SigningProvider *)0x0) {
    (*(*(_func_int ***)store)[1])(store);
  }
  if (*(sp_counted_base **)(in_FS_OFFSET + 0x28) != local_30.pi_) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>,_true,_true>
          )(__uniq_ptr_data<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CKeyMetadata> DescriptorScriptPubKeyMan::GetMetadata(const CTxDestination& dest) const
{
    std::unique_ptr<SigningProvider> provider = GetSigningProvider(GetScriptForDestination(dest));
    if (provider) {
        KeyOriginInfo orig;
        CKeyID key_id = GetKeyForDestination(*provider, dest);
        if (provider->GetKeyOrigin(key_id, orig)) {
            LOCK(cs_desc_man);
            std::unique_ptr<CKeyMetadata> meta = std::make_unique<CKeyMetadata>();
            meta->key_origin = orig;
            meta->has_key_origin = true;
            meta->nCreateTime = m_wallet_descriptor.creation_time;
            return meta;
        }
    }
    return nullptr;
}